

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O3

dynamic_truth_table * __thiscall
kitty::binary_operation<kitty::dynamic_truth_table,std::bit_or<void>>
          (dynamic_truth_table *__return_storage_ptr__,kitty *this,dynamic_truth_table *first,
          dynamic_truth_table *second,bit_or<void> *op)

{
  ulong *puVar1;
  uint uVar2;
  ulong *puVar3;
  ulong *puVar4;
  pointer puVar5;
  uint uVar6;
  long lVar7;
  allocator_type local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar2 = *(uint *)(this + 0x18);
  uVar6 = 1 << ((char)uVar2 - 6U & 0x1f);
  if ((ulong)uVar2 < 7) {
    uVar6 = 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,(ulong)uVar6,&local_49);
  puVar3 = *(ulong **)this;
  puVar4 = *(ulong **)(this + 8);
  if (puVar3 != puVar4) {
    puVar5 = (first->_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      puVar1 = (ulong *)((long)puVar3 + lVar7);
      *(ulong *)((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar7) =
           *(ulong *)((long)puVar5 + lVar7) | *puVar1;
      lVar7 = lVar7 + 8;
    } while (puVar1 + 1 != puVar4);
  }
  if (uVar2 < 6) {
    *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start =
         *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start & *(ulong *)(detail::masks + (ulong)uVar2 * 8);
  }
  (__return_storage_ptr__->_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  __return_storage_ptr__->_num_vars = uVar2;
  return __return_storage_ptr__;
}

Assistant:

auto binary_operation( const TT& first, const TT& second, Fn&& op )
{
  assert( first.num_vars() == second.num_vars() );

  auto result = first.construct();
  std::transform( first.cbegin(), first.cend(), second.cbegin(), result.begin(), op );
  result.mask_bits();
  return result;
}